

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

void __thiscall CLI::App::_configure(App *this)

{
  pointer psVar1;
  bool bVar2;
  element_type *this_00;
  App_p *app;
  pointer psVar3;
  
  if (this->default_startup == enabled) {
    bVar2 = false;
  }
  else {
    if (this->default_startup != disabled) goto LAB_001131d6;
    bVar2 = true;
  }
  this->disabled_ = bVar2;
LAB_001131d6:
  psVar1 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    this_00 = (psVar3->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (this_00->has_automatic_name_ == true) {
      (this_00->name_)._M_string_length = 0;
      *(this_00->name_)._M_dataplus._M_p = '\0';
      this_00 = (psVar3->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    if ((this_00->name_)._M_string_length == 0) {
      this_00->fallthrough_ = false;
      this_00->prefix_command_ = false;
    }
    this_00->parent_ = this;
    _configure(this_00);
  }
  return;
}

Assistant:

void _configure() {
        if(default_startup == startup_mode::enabled) {
            disabled_ = false;
        } else if(default_startup == startup_mode::disabled) {
            disabled_ = true;
        }
        for(const App_p &app : subcommands_) {
            if(app->has_automatic_name_) {
                app->name_.clear();
            }
            if(app->name_.empty()) {
                app->fallthrough_ = false; // make sure fallthrough_ is false to prevent infinite loop
                app->prefix_command_ = false;
            }
            // make sure the parent is set to be this object in preparation for parse
            app->parent_ = this;
            app->_configure();
        }
    }